

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O3

bool __thiscall
duckdb::CatalogSet::CreateEntry
          (CatalogSet *this,CatalogTransaction transaction,string *name,
          unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *value,
          LogicalDependencyList *dependencies)

{
  CatalogType CVar1;
  mutex_type *this_00;
  bool bVar2;
  int iVar3;
  type pCVar4;
  pointer pCVar5;
  undefined4 extraout_var;
  mutex *__mutex;
  unique_lock<std::mutex> read_lock;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_48;
  unique_lock<std::mutex> local_40;
  
  pCVar4 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator*(value);
  CheckCatalogEntryInvariants(this,pCVar4,name);
  pCVar5 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator->(value);
  LOCK();
  (pCVar5->timestamp).super___atomic_base<unsigned_long>._M_i = transaction.transaction_id;
  UNLOCK();
  pCVar5 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator->(value);
  (pCVar5->set).ptr = this;
  iVar3 = (*(this->catalog->super_Catalog)._vptr_Catalog[0x1a])();
  local_40._M_device = (mutex_type *)CONCAT44(extraout_var,iVar3);
  optional_ptr<duckdb::DependencyManager,_true>::CheckValid
            ((optional_ptr<duckdb::DependencyManager,_true> *)&local_40);
  this_00 = local_40._M_device;
  pCVar4 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator*(value);
  if (pCVar4->internal == false) {
    CVar1 = pCVar4->type;
    if (((CVar1 != DATABASE_ENTRY) && (CVar1 != RENAMED_ENTRY)) && (CVar1 != DEPENDENCY_ENTRY)) {
      DependencyManager::CreateDependencies
                ((DependencyManager *)this_00,transaction,pCVar4,dependencies);
    }
  }
  __mutex = &this->catalog->write_lock;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    local_40._M_device = &this->catalog_lock;
    local_40._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    local_48._M_head_impl =
         (value->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
    (value->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)._M_t
    .super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
    super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = (CatalogEntry *)0x0;
    bVar2 = CreateEntryInternal(this,transaction,name,
                                (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                                 *)&local_48,&local_40,true);
    if (local_48._M_head_impl != (CatalogEntry *)0x0) {
      (*(local_48._M_head_impl)->_vptr_CatalogEntry[1])();
    }
    ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return bVar2;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

bool CatalogSet::CreateEntry(CatalogTransaction transaction, const string &name, unique_ptr<CatalogEntry> value,
                             const LogicalDependencyList &dependencies) {
	CheckCatalogEntryInvariants(*value, name);

	// Mark this entry as being created by the current active transaction
	value->timestamp = transaction.transaction_id;
	value->set = this;
	catalog.GetDependencyManager()->AddObject(transaction, *value, dependencies);

	// lock the catalog for writing
	lock_guard<mutex> write_lock(catalog.GetWriteLock());
	// lock this catalog set to disallow reading
	unique_lock<mutex> read_lock(catalog_lock);

	return CreateEntryInternal(transaction, name, std::move(value), read_lock);
}